

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

int formparse(OperationConfig *config,char *input,tool_mime **mimeroot,tool_mime **mimecurrent,
             _Bool literal_value)

{
  char cVar1;
  int iVar2;
  tool_mime *ptVar3;
  char *__s;
  char *pcVar4;
  tool_mime *ptVar5;
  GlobalConfig *config_00;
  char *pcVar6;
  curl_slist *headers;
  CURLcode local_6c;
  char *type;
  int local_5c;
  char *data;
  char *local_50;
  char *encoder;
  char *local_40;
  char *filename;
  
  type = (char *)0x0;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  headers = (curl_slist *)0x0;
  if (*mimecurrent == (tool_mime *)0x0) {
    __s = (char *)0x0;
    ptVar3 = tool_mime_new_parts((tool_mime *)0x0);
    *mimeroot = ptVar3;
    if (ptVar3 != (tool_mime *)0x0) {
      *mimecurrent = ptVar3;
      goto LAB_0010d8e9;
    }
  }
  else {
LAB_0010d8e9:
    __s = strdup(input);
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
    }
    else {
      pcVar4 = strchr(__s,0x3d);
      if (pcVar4 != (char *)0x0) {
        pcVar6 = (char *)0x0;
        if (__s < pcVar4) {
          pcVar6 = __s;
        }
        local_50 = pcVar4 + 1;
        *pcVar4 = '\0';
        cVar1 = pcVar4[1];
        if (cVar1 == '(' && !literal_value) {
          local_40 = pcVar6;
          iVar2 = get_param_part(config,'\0',&local_50,&data,&type,(char **)0x0,(char **)0x0,
                                 &headers);
          if ((iVar2 < 0) ||
             (ptVar3 = tool_mime_new_parts(*mimecurrent), ptVar3 == (tool_mime *)0x0))
          goto LAB_0010dd4a;
          *mimecurrent = ptVar3;
          ptVar3->headers = headers;
          headers = (curl_slist *)0x0;
          if (type != (char *)0x0) {
            pcVar4 = strdup(type);
            ptVar3->type = pcVar4;
            if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
          }
LAB_0010dc78:
          if (local_40 != (char *)0x0) {
            pcVar4 = strdup(local_40);
            ptVar3->name = pcVar4;
            if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
          }
        }
        else {
          if (cVar1 != ')' || pcVar6 != (char *)0x0) {
            if (cVar1 == '@' && !literal_value) {
              ptVar3 = (tool_mime *)0x0;
              local_40 = pcVar6;
              do {
                local_50 = local_50 + 1;
                iVar2 = get_param_part(config,',',&local_50,&data,&type,&filename,&encoder,&headers)
                ;
                if ((iVar2 < 0) ||
                   ((((ptVar3 == (tool_mime *)0x0 && (ptVar3 = *mimecurrent, iVar2 == 0x2c)) &&
                     (ptVar3 = tool_mime_new_parts(ptVar3), ptVar3 == (tool_mime *)0x0)) ||
                    (ptVar5 = tool_mime_new_filedata(ptVar3,data,true,&local_6c),
                    ptVar5 == (tool_mime *)0x0)))) goto LAB_0010dd4a;
                ptVar5->headers = headers;
                headers = (curl_slist *)0x0;
                config_00 = config->global;
                ptVar5->config = config_00;
                if (local_6c == CURLE_READ_ERROR) {
                  if (0 < ptVar5->size) goto LAB_0010dd22;
                  free(ptVar5->data);
                  ptVar5->data = (char *)0x0;
                  ptVar5->size = -1;
                  local_6c = CURLE_OK;
                }
                if (filename != (char *)0x0) {
                  pcVar4 = strdup(filename);
                  ptVar5->filename = pcVar4;
                  if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
                }
                if (type != (char *)0x0) {
                  pcVar4 = strdup(type);
                  ptVar5->type = pcVar4;
                  if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
                }
                if (encoder != (char *)0x0) {
                  pcVar4 = strdup(encoder);
                  ptVar5->encoder = pcVar4;
                  if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
                }
              } while (iVar2 != 0);
              ptVar3 = (*mimecurrent)->subparts;
              goto LAB_0010dc78;
            }
            if (cVar1 != '<' || literal_value) goto LAB_0010da39;
            local_50 = pcVar4 + 2;
            local_40 = pcVar6;
            local_5c = get_param_part(config,'\0',&local_50,&data,&type,(char **)0x0,&encoder,
                                      &headers);
            if ((local_5c < 0) ||
               (ptVar3 = tool_mime_new_filedata(*mimecurrent,data,false,&local_6c),
               ptVar3 == (tool_mime *)0x0)) goto LAB_0010dd4a;
            ptVar3->headers = headers;
            headers = (curl_slist *)0x0;
            config_00 = config->global;
            ptVar3->config = config_00;
            if (local_6c == CURLE_READ_ERROR) {
              if (0 < ptVar3->size) {
LAB_0010dd22:
                headers = (curl_slist *)0x0;
                pcVar4 = "error while reading standard input";
                goto LAB_0010d984;
              }
              free(ptVar3->data);
              ptVar3->data = (char *)0x0;
              ptVar3->size = -1;
            }
LAB_0010dac6:
            if (filename != (char *)0x0) {
              pcVar4 = strdup(filename);
              ptVar3->filename = pcVar4;
              if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
            }
            if (type != (char *)0x0) {
              pcVar4 = strdup(type);
              ptVar3->type = pcVar4;
              if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
            }
            if (encoder != (char *)0x0) {
              pcVar4 = strdup(encoder);
              ptVar3->encoder = pcVar4;
              if (pcVar4 == (char *)0x0) goto LAB_0010dd4a;
            }
            if (local_5c != 0) {
              *local_50 = (char)local_5c;
              warnf(config->global,"garbage at end of field specification: %s");
            }
            goto LAB_0010dc78;
          }
          if (pcVar4[2] != '\0' || literal_value) {
LAB_0010da39:
            local_5c = 0;
            pcVar4 = local_50;
            local_40 = pcVar6;
            if ((literal_value) ||
               (local_5c = get_param_part(config,'\0',&local_50,&data,&type,&filename,&encoder,
                                          &headers), pcVar4 = data, -1 < local_5c)) {
              ptVar3 = *mimecurrent;
              pcVar4 = strdup(pcVar4);
              if (pcVar4 != (char *)0x0) {
                ptVar3 = tool_mime_new(ptVar3,TOOLMIME_DATA);
                if (ptVar3 != (tool_mime *)0x0) {
                  ptVar3->data = pcVar4;
                  ptVar3->headers = headers;
                  headers = (curl_slist *)0x0;
                  goto LAB_0010dac6;
                }
                free(pcVar4);
              }
            }
            goto LAB_0010dd4a;
          }
          if (*mimecurrent == *mimeroot) {
            config_00 = config->global;
            pcVar4 = "no multipart to terminate";
            goto LAB_0010d984;
          }
          *mimecurrent = (*mimecurrent)->parent;
        }
        iVar2 = 0;
        goto LAB_0010dd4d;
      }
      config_00 = config->global;
      pcVar4 = "Illegally formatted input field";
LAB_0010d984:
      warnf(config_00,pcVar4);
    }
  }
LAB_0010dd4a:
  iVar2 = 1;
LAB_0010dd4d:
  free(__s);
  curl_slist_free_all(headers);
  return iVar2;
}

Assistant:

int formparse(struct OperationConfig *config,
              const char *input,
              struct tool_mime **mimeroot,
              struct tool_mime **mimecurrent,
              bool literal_value)
{
  /* input MUST be a string in the format 'name=contents' and we will
     build a linked list with the info */
  char *name = NULL;
  char *contents = NULL;
  char *contp;
  char *data;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  struct curl_slist *headers = NULL;
  struct tool_mime *part = NULL;
  CURLcode res;
  int err = 1;

  /* Allocate the main mime structure if needed. */
  if(!*mimecurrent) {
    *mimeroot = tool_mime_new_parts(NULL);
    if(!*mimeroot)
      goto fail;
    *mimecurrent = *mimeroot;
  }

  /* Make a copy we can overwrite. */
  contents = strdup(input);
  if(!contents)
    goto fail;

  /* Scan for the end of the name. */
  contp = strchr(contents, '=');
  if(contp) {
    int sep = '\0';
    if(contp > contents)
      name = contents;
    *contp++ = '\0';

    if(*contp == '(' && !literal_value) {
      /* Starting a multipart. */
      sep = get_param_part(config, '\0',
                           &contp, &data, &type, NULL, NULL, &headers);
      if(sep < 0)
        goto fail;
      part = tool_mime_new_parts(*mimecurrent);
      if(!part)
        goto fail;
      *mimecurrent = part;
      part->headers = headers;
      headers = NULL;
      SET_TOOL_MIME_PTR(part, type);
    }
    else if(!name && !strcmp(contp, ")") && !literal_value) {
      /* Ending a multipart. */
      if(*mimecurrent == *mimeroot) {
        warnf(config->global, "no multipart to terminate");
        goto fail;
      }
      *mimecurrent = (*mimecurrent)->parent;
    }
    else if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate filename(s) */

      struct tool_mime *subparts = NULL;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        ++contp;
        sep = get_param_part(config, ',', &contp,
                             &data, &type, &filename, &encoder, &headers);
        if(sep < 0) {
          goto fail;
        }

        /* now contp point to comma or string end.
           If more files to come, make sure we have multiparts. */
        if(!subparts) {
          if(sep != ',')    /* If there is a single file. */
            subparts = *mimecurrent;
          else {
            subparts = tool_mime_new_parts(*mimecurrent);
            if(!subparts)
              goto fail;
          }
        }

        /* Store that file in a part. */
        part = tool_mime_new_filedata(subparts, data, TRUE, &res);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
        part->config = config->global;
        if(res == CURLE_READ_ERROR) {
            /* An error occurred while reading stdin: if read has started,
               issue the error now. Else, delay it until processed by
               libcurl. */
          if(part->size > 0) {
            warnf(config->global,
                  "error while reading standard input");
            goto fail;
          }
          curlx_safefree(part->data);
          part->size = -1;
          res = CURLE_OK;
        }
        SET_TOOL_MIME_PTR(part, filename);
        SET_TOOL_MIME_PTR(part, type);
        SET_TOOL_MIME_PTR(part, encoder);

        /* *contp could be '\0', so we just check with the delimiter */
      } while(sep); /* loop if there is another filename */
      part = (*mimecurrent)->subparts;  /* Set name on group. */
    }
    else {
      if(*contp == '<' && !literal_value) {
        ++contp;
        sep = get_param_part(config, '\0', &contp,
                             &data, &type, NULL, &encoder, &headers);
        if(sep < 0)
          goto fail;

        part = tool_mime_new_filedata(*mimecurrent, data, FALSE,
                                      &res);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
        part->config = config->global;
        if(res == CURLE_READ_ERROR) {
            /* An error occurred while reading stdin: if read has started,
               issue the error now. Else, delay it until processed by
               libcurl. */
          if(part->size > 0) {
            warnf(config->global,
                  "error while reading standard input");
            goto fail;
          }
          curlx_safefree(part->data);
          part->size = -1;
          res = CURLE_OK;
        }
      }
      else {
        if(literal_value)
          data = contp;
        else {
          sep = get_param_part(config, '\0', &contp,
                               &data, &type, &filename, &encoder, &headers);
          if(sep < 0)
            goto fail;
        }

        part = tool_mime_new_data(*mimecurrent, data);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
      }

      SET_TOOL_MIME_PTR(part, filename);
      SET_TOOL_MIME_PTR(part, type);
      SET_TOOL_MIME_PTR(part, encoder);

      if(sep) {
        *contp = (char) sep;
        warnf(config->global,
              "garbage at end of field specification: %s", contp);
      }
    }

    /* Set part name. */
    SET_TOOL_MIME_PTR(part, name);
  }
  else {
    warnf(config->global, "Illegally formatted input field");
    goto fail;
  }
  err = 0;
fail:
  curlx_safefree(contents);
  curl_slist_free_all(headers);
  return err;
}